

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

Am_Wrapper * compute_list_path_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Am_Value_List list;
  Am_Value_List new_list;
  Am_Value value2;
  Am_Value value1;
  Am_Value_List local_70;
  Am_Value_List local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(self,0x181,1);
  Am_Value::operator=(&local_40,pAVar3);
  local_50.type = 0;
  local_50.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(self,0x182,1);
  Am_Value::operator=(&local_50,pAVar3);
  pAVar3 = Am_Object::Get(self,0x114,0);
  Am_Value_List::Am_Value_List(&local_70,pAVar3);
  Am_Value_List::Am_Value_List(&local_60);
  bVar1 = Am_Value_List::Valid(&local_70);
  if (bVar1) {
    Am_Value_List::Start(&local_70);
    bVar1 = Am_Value_List::Last(&local_70);
    iVar6 = -1;
    if (!bVar1) {
      iVar5 = 0;
      do {
        pAVar3 = Am_Value_List::Get(&local_70);
        bVar1 = Am_Value::operator==(&local_40,pAVar3);
        iVar6 = iVar5;
        if (bVar1) break;
        Am_Value_List::Next(&local_70);
        bVar1 = Am_Value_List::Last(&local_70);
        iVar5 = iVar5 + 1;
        iVar6 = -1;
      } while (!bVar1);
    }
    iVar5 = 0;
    if (iVar6 != -1) {
      iVar5 = iVar6;
    }
    Am_Value_List::Start(&local_70);
    bVar1 = Am_Value_List::Last(&local_70);
    iVar6 = -1;
    if (!bVar1) {
      iVar7 = 0;
      do {
        pAVar3 = Am_Value_List::Get(&local_70);
        bVar1 = Am_Value::operator==(&local_50,pAVar3);
        iVar6 = iVar7;
        if (bVar1) break;
        Am_Value_List::Next(&local_70);
        bVar1 = Am_Value_List::Last(&local_70);
        iVar7 = iVar7 + 1;
        iVar6 = -1;
      } while (!bVar1);
    }
    if (iVar6 == -1) {
      uVar2 = Am_Value_List::Length(&local_70);
      iVar6 = uVar2 - 1;
    }
    Am_Value_List::Start(&local_70);
    Am_Value_List::Move_Nth(&local_70,iVar5);
    pAVar3 = Am_Value_List::Get(&local_70);
    Am_Object::Set(self,0x181,pAVar3,0);
    iVar7 = iVar6 - iVar5;
    if (iVar7 != 0 && iVar5 <= iVar6) {
      do {
        pAVar3 = Am_Value_List::Get(&local_70);
        Am_Value_List::Add(&local_60,pAVar3,Am_TAIL,true);
        Am_Value_List::Next(&local_70);
        iVar7 = iVar7 + -1;
        iVar5 = iVar6;
      } while (iVar7 != 0);
    }
    if (iVar6 < iVar5) {
      do {
        pAVar3 = Am_Value_List::Get(&local_70);
        Am_Value_List::Add(&local_60,pAVar3,Am_TAIL,true);
        Am_Value_List::Prev(&local_70);
        iVar5 = iVar5 + -1;
      } while (iVar6 < iVar5);
    }
    pAVar3 = Am_Value_List::Get(&local_70);
    Am_Value_List::Add(&local_60,pAVar3,Am_TAIL,true);
    pAVar3 = Am_Value_List::Get(&local_70);
    Am_Object::Set(self,0x182,pAVar3,0);
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_60);
  }
  else {
    pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  }
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Value_List::~Am_Value_List(&local_70);
  Am_Value::~Am_Value(&local_50);
  Am_Value::~Am_Value(&local_40);
  return pAVar4;
}

Assistant:

Am_Define_Value_List_Formula(compute_list_path)
{
  Am_Value value1;
  value1 = self.Peek(Am_VALUE_1);
  Am_Value value2;
  value2 = self.Peek(Am_VALUE_2);
  Am_Value_List list = self.Get(Am_LIST_OF_VALUES);
  Am_Value_List new_list;

  if (!list.Valid())
    return list;

  // find value1 and value2 in the list.
  // if value1 isn't present, assume first element;
  // if value2 isn't present, assume last.
  int value1_pos = list_position(list, value1);
  if (value1_pos == -1)
    value1_pos = 0;

  int value2_pos = list_position(list, value2);
  if (value2_pos == -1)
    value2_pos = ((int)list.Length()) - 1;

  // starting at value1...
  list.Start();
  list.Move_Nth(value1_pos);
  self.Set(Am_VALUE_1, list.Get());
  int i = value1_pos;

  // either add following elements (if value1 precedes value2)
  while (i < value2_pos) {
    new_list.Add(list.Get());
    list.Next();
    ++i;
  }

  // OR, add preceding elements (if value1 follows value2)
  while (i > value2_pos) {
    new_list.Add(list.Get());
    list.Prev();
    --i;
  }

  // then add value2 itself
  new_list.Add(list.Get());
  self.Set(Am_VALUE_2, list.Get());

  return new_list;
}